

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O2

void __thiscall
camera<double>::camera
          (camera<double> *this,point3<double> *from,point3<double> *to,vec3<double> *vup,
          double *fov,double *ar,double *ap,double *focus,double *t0,double *t1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vec3<double> local_60;
  vec3<double> local_48;
  
  memset(this,0,0xa8);
  dVar3 = tan(((*fov * 3.141592653589793) / 180.0) * 0.5);
  dVar1 = *ar;
  local_48.e[2] = from->e[2] - to->e[2];
  local_48.e[0] = from->e[0] - to->e[0];
  local_48.e[1] = from->e[1] - to->e[1];
  unit_v<double>(&local_60,&local_48);
  (this->w).e[2] = local_60.e[2];
  (this->w).e[0] = local_60.e[0];
  (this->w).e[1] = local_60.e[1];
  cross<double>(vup,&this->w);
  unit_v<double>(&local_60,&local_48);
  (this->u).e[2] = local_60.e[2];
  (this->u).e[0] = local_60.e[0];
  (this->u).e[1] = local_60.e[1];
  cross<double>(&this->w,&this->u);
  (this->v).e[2] = local_60.e[2];
  (this->v).e[0] = local_60.e[0];
  (this->v).e[1] = local_60.e[1];
  this->t0_ = *t0;
  this->t1_ = *t1;
  dVar2 = from->e[1];
  (this->o_).e[0] = from->e[0];
  (this->o_).e[1] = dVar2;
  (this->o_).e[2] = from->e[2];
  dVar8 = dVar1 * (dVar3 + dVar3) * *focus;
  dVar6 = (this->u).e[2] * dVar8;
  (this->hor_).e[2] = dVar6;
  dVar1 = (this->o_).e[2];
  dVar7 = (this->u).e[0] * dVar8;
  dVar8 = (this->u).e[1] * dVar8;
  dVar9 = (this->v).e[0];
  dVar2 = (this->v).e[1];
  (this->hor_).e[0] = dVar7;
  (this->hor_).e[1] = dVar8;
  dVar10 = (dVar3 + dVar3) * *focus;
  dVar11 = dVar10 * (this->v).e[2];
  dVar9 = dVar10 * dVar9;
  dVar10 = dVar10 * dVar2;
  (this->ver_).e[0] = dVar9;
  (this->ver_).e[1] = dVar10;
  (this->ver_).e[2] = dVar11;
  dVar3 = *focus;
  dVar2 = (this->w).e[2];
  dVar4 = (this->o_).e[1];
  dVar5 = (this->w).e[1];
  (this->llc_).e[0] = (((this->o_).e[0] - dVar7 * 0.5) - dVar9 * 0.5) - dVar3 * (this->w).e[0];
  (this->llc_).e[1] = ((dVar4 - dVar8 * 0.5) - dVar10 * 0.5) - dVar3 * dVar5;
  (this->llc_).e[2] = ((dVar1 - dVar6 * 0.5) - dVar11 * 0.5) - dVar2 * dVar3;
  this->r_ = *ap * 0.5;
  return;
}

Assistant:

camera(const point3<T>& from,
         const point3<T>& to,
         const vec3<T>& vup,
         const T& fov,
         const T& ar,
         const T& ap,
         const T& focus,
         const T& t0 = 0,
         const T& t1 = 0) {
    T t = deg_to_rad(fov);
    T h = std::tan(t / static_cast<T>(2));
    T vp_height = static_cast<T>(2.0) * h;
    T vp_width = ar * vp_height;
    // T focus = 1.0;

    w = unit_v<T>(from - to);
    u = unit_v<T>(cross<T>(vup, w));
    v = cross<T>(w, u);

    t0_ = t0;
    t1_ = t1;

    o_ = from;
    hor_ = focus * vp_width * u;
    ver_ = focus * vp_height * v;
    llc_ = o_ - hor_ / static_cast<T>(2.0) - ver_ / static_cast<T>(2.0) -
           focus * w;

    r_ = ap / static_cast<T>(2);
  }